

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iec61131.l.cpp
# Opt level: O1

int __thiscall deci_FlexLexer::yyinput(deci_FlexLexer *this)

{
  int *piVar1;
  byte bVar2;
  char *pcVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  char *pcVar7;
  
  *this->yy_c_buf_p = this->yy_hold_char;
  pcVar7 = this->yy_c_buf_p;
  if (*pcVar7 == '\0') {
    if (pcVar7 < this->yy_buffer_stack[this->yy_buffer_stack_top]->yy_ch_buf + this->yy_n_chars) {
      *pcVar7 = '\0';
    }
    else {
      pcVar3 = (this->super_FlexLexer).yytext;
      this->yy_c_buf_p = pcVar7 + 1;
      iVar5 = yy_get_next_buffer(this);
      if (iVar5 == 0) {
        pcVar7 = (this->super_FlexLexer).yytext + ((int)pcVar7 - (int)pcVar3);
        this->yy_c_buf_p = pcVar7;
        bVar4 = true;
      }
      else {
        if (iVar5 != 1) {
          (*(this->super_FlexLexer)._vptr_FlexLexer[7])(this,&this->yyin);
        }
        iVar5 = (*(this->super_FlexLexer)._vptr_FlexLexer[0xb])(this);
        pcVar7 = (char *)0x0;
        bVar4 = false;
        if (iVar5 == 0) {
          if (this->yy_did_buffer_switch_on_eof == 0) {
            (*(this->super_FlexLexer)._vptr_FlexLexer[7])(this,&this->yyin);
          }
          uVar6 = yyinput(this);
          pcVar7 = (char *)(ulong)uVar6;
          bVar4 = false;
        }
      }
      if (!bVar4) {
        return (int)pcVar7;
      }
    }
  }
  bVar2 = *this->yy_c_buf_p;
  *this->yy_c_buf_p = 0;
  pcVar7 = this->yy_c_buf_p;
  this->yy_c_buf_p = pcVar7 + 1;
  this->yy_hold_char = pcVar7[1];
  if (bVar2 == 10) {
    piVar1 = &(this->super_FlexLexer).yylineno;
    *piVar1 = *piVar1 + 1;
  }
  return (uint)bVar2;
}

Assistant:

int yyFlexLexer::yyinput()
{
	int c;
    
	*(yy_c_buf_p) = (yy_hold_char);

	if ( *(yy_c_buf_p) == YY_END_OF_BUFFER_CHAR )
		{
		/* yy_c_buf_p now points to the character we want to return.
		 * If this occurs *before* the EOB characters, then it's a
		 * valid NUL; if not, then we've hit the end of the buffer.
		 */
		if ( (yy_c_buf_p) < &YY_CURRENT_BUFFER_LVALUE->yy_ch_buf[(yy_n_chars)] )
			/* This was really a NUL. */
			*(yy_c_buf_p) = '\0';

		else
			{ /* need more input */
			int offset = (int) ((yy_c_buf_p) - (yytext_ptr));
			++(yy_c_buf_p);

			switch ( yy_get_next_buffer(  ) )
				{
				case EOB_ACT_LAST_MATCH:
					/* This happens because yy_g_n_b()
					 * sees that we've accumulated a
					 * token and flags that we need to
					 * try matching the token before
					 * proceeding.  But for input(),
					 * there's no matching to consider.
					 * So convert the EOB_ACT_LAST_MATCH
					 * to EOB_ACT_END_OF_FILE.
					 */

					/* Reset buffer status. */
					yyrestart( yyin );

					/*FALLTHROUGH*/

				case EOB_ACT_END_OF_FILE:
					{
					if ( yywrap(  ) )
						return 0;

					if ( ! (yy_did_buffer_switch_on_eof) )
						YY_NEW_FILE;
#ifdef __cplusplus
					return yyinput();
#else
					return input();
#endif
					}

				case EOB_ACT_CONTINUE_SCAN:
					(yy_c_buf_p) = (yytext_ptr) + offset;
					break;
				}
			}
		}

	c = *(unsigned char *) (yy_c_buf_p);	/* cast for 8-bit char's */
	*(yy_c_buf_p) = '\0';	/* preserve yytext */
	(yy_hold_char) = *++(yy_c_buf_p);

	if ( c == '\n' )
		
    yylineno++;
;

	return c;
}